

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O1

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* wasm::DFA::Internal::refinePartitionsImpl
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *__return_storage_ptr__,InputGraph *inputGraph)

{
  pointer *this;
  long *plVar1;
  pointer pvVar2;
  ulong *puVar3;
  pointer puVar4;
  pointer puVar5;
  iterator __position;
  _Base_ptr p_Var6;
  size_t sVar7;
  unsigned_long uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  void *pvVar13;
  pointer puVar14;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *partition;
  pointer pvVar15;
  Partitions *pPVar16;
  Partitions *pPVar17;
  pointer pTVar18;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar19;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  _Rb_tree_node_base *p_Var20;
  Partitions *pPVar21;
  ulong uVar22;
  long lVar23;
  Partitions *pPVar24;
  _Base_ptr p_Var25;
  InputGraph *__range2;
  ulong *puVar26;
  pointer puVar27;
  pointer pvVar28;
  _Link_type __x;
  unsigned_long uVar29;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *partition_1;
  pointer pvVar30;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar31;
  long *plVar32;
  ulong uVar33;
  _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  *p_Var34;
  undefined1 auVar35 [8];
  Partitions *pPVar36;
  size_t sVar37;
  pointer __dest;
  long lVar38;
  size_t *psVar39;
  bool bVar40;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar41;
  size_t local_258;
  size_t newSplitter;
  _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  *local_248;
  undefined1 local_240 [8];
  Set splitter;
  undefined1 local_228 [8];
  Partitions partitions;
  Partitions splitters;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *resultPartitions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> potentialSplitters;
  undefined1 auStack_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> transitionIndices;
  undefined1 auStack_88 [8];
  Set partition_2;
  size_t *psStack_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> markedPartitions;
  pointer local_48;
  
  pvVar15 = (inputGraph->
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar30 = (inputGraph->
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar15 == pvVar30) {
    p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
               *)0x0;
    pPVar36 = (Partitions *)0x0;
  }
  else {
    pPVar36 = (Partitions *)0x0;
    p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
               *)0x0;
    do {
      pvVar28 = (pvVar15->
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (pvVar15->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar23 = (long)pvVar2 - (long)pvVar28;
      if (lVar23 != 0) {
        do {
          p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                     *)((long)&(p_Var34->_M_impl).super__Vector_impl_data._M_start +
                       ((long)(pvVar28->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar28->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3));
          pvVar28 = pvVar28 + 1;
        } while (pvVar28 != pvVar2);
      }
      pPVar36 = (Partitions *)((long)pPVar36 + (lVar23 >> 3) * -0x5555555555555555);
      pvVar15 = pvVar15 + 1;
    } while (pvVar15 != pvVar30);
  }
  pPVar21 = pPVar36;
  anon_unknown_0::Partitions::Partitions((Partitions *)local_228,(size_t)pPVar36);
  pvVar15 = (inputGraph->
            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(inputGraph->
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar15 !=
      (pointer)splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    uVar29 = 0;
    pvVar30 = pvVar15;
    do {
      uVar33 = (long)local_228 + 1;
      partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[(long)local_228] = uVar29;
      partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[(long)local_228] = uVar29;
      lVar23 = (long)(pvVar30->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar30->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      if (lVar23 != 0) {
        lVar23 = (lVar23 >> 3) * -0x5555555555555555;
        lVar23 = lVar23 + (ulong)(lVar23 == 0);
        do {
          *(unsigned_long *)(partitions.sets + uVar29 * 8) = uVar29;
          partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar29] = uVar29;
          partitions.elementIndices.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar29] = (unsigned_long)local_228;
          uVar29 = uVar29 + 1;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[(long)local_228] = uVar29;
      pvVar30 = pvVar30 + 1;
      pPVar21 = (Partitions *)
                partitions.elements.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      local_228 = (undefined1  [8])uVar33;
    } while (pvVar30 !=
             (pointer)splitters.pivots.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  auStack_b8 = (undefined1  [8])0x0;
  transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  splitters.sets._0_4_ = 0;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = &splitters.sets;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &splitters.sets;
  splitters.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_248 = p_Var34;
  splitter.index = (size_t)pPVar36;
  if (pvVar15 !=
      (pointer)splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      pvVar2 = (pvVar15->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      newSplitter = (size_t)pvVar15;
      for (pvVar28 = (pvVar15->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pvVar28 != pvVar2;
          pvVar28 = pvVar28 + 1) {
        puVar26 = (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pvVar28->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar26 != puVar3) {
          uVar29 = 0;
          do {
            pPVar36 = &splitters;
            if (splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              pPVar16 = (Partitions *)
                        splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                bVar40 = (pPVar16->elementIndices).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start < (pointer)*puVar26;
                if (!bVar40) {
                  pPVar36 = pPVar16;
                }
                pPVar16 = (Partitions *)
                          (&(pPVar16->elements).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish)[bVar40];
              } while (pPVar16 != (Partitions *)0x0);
            }
            if ((pPVar36 == &splitters) ||
               ((pointer)*puVar26 <
                (pPVar36->elementIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start)) {
              pPVar16 = (Partitions *)operator_new(0x40);
              pPVar24 = (Partitions *)&pPVar16->elementIndices;
              puVar27 = (pointer)*puVar26;
              (pPVar16->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = puVar27;
              (pPVar16->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (pPVar16->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (pPVar16->setIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              if (pPVar36 == &splitters) {
                if ((splitters.elementIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start == (pointer)0x0) ||
                   (puVar27 <=
                    (pointer)splitters.elements.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[4])) {
LAB_00c39f7f:
                  pVar41 = std::
                           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                           ::_M_get_insert_unique_pos
                                     ((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                                       *)&partitions.pivots.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (key_type_conflict *)pPVar24);
                  pPVar21 = pPVar24;
                }
                else {
LAB_00c39f93:
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ =
                       splitters.elements.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
                  pVar41 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                           (auVar12 << 0x40);
                }
              }
              else {
                puVar4 = (pPVar36->elementIndices).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (puVar27 < puVar4) {
                  pVar41.second =
                       (_Rb_tree_node_base *)
                       splitters.elements.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  pVar41.first = (_Rb_tree_node_base *)
                                 splitters.elements.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                  if ((Partitions *)
                      splitters.elements.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish != pPVar36) {
                    pPVar17 = (Partitions *)std::_Rb_tree_decrement((_Rb_tree_node_base *)pPVar36);
                    if (puVar27 <=
                        (pPVar17->elementIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) goto LAB_00c39f7f;
                    pPVar24 = pPVar36;
                    if ((pPVar17->elements).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                      pPVar36 = pPVar17;
                      pPVar24 = (Partitions *)0x0;
                    }
                    pVar41.second = (_Rb_tree_node_base *)pPVar36;
                    pVar41.first = (_Rb_tree_node_base *)pPVar24;
                  }
                }
                else if (puVar4 < puVar27) {
                  if ((Partitions *)
                      splitters.elements.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == pPVar36) goto LAB_00c39f93;
                  pPVar17 = (Partitions *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar36);
                  if ((pPVar17->elementIndices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start <= puVar27) goto LAB_00c39f7f;
                  pPVar24 = pPVar17;
                  if ((pPVar36->elements).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                    pPVar17 = pPVar36;
                    pPVar24 = (Partitions *)0x0;
                  }
                  pVar41.second = (_Rb_tree_node_base *)pPVar17;
                  pVar41.first = (_Rb_tree_node_base *)pPVar24;
                }
                else {
                  pVar41.second = (_Rb_tree_node_base *)0x0;
                  pVar41.first = (_Rb_tree_node_base *)pPVar36;
                }
              }
              pPVar24 = (Partitions *)pVar41.second;
              pPVar36 = (Partitions *)pVar41.first;
              if (pPVar24 == (Partitions *)0x0) {
                std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                ::_M_drop_node((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                                *)pPVar16,(_Link_type)pPVar21);
              }
              else {
                bVar40 = true;
                if ((pPVar36 == (Partitions *)0x0) && (&splitters != pPVar24)) {
                  bVar40 = puVar27 < (pPVar24->elementIndices).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                }
                pPVar21 = pPVar16;
                std::_Rb_tree_insert_and_rebalance
                          (bVar40,(_Rb_tree_node_base *)pPVar16,(_Rb_tree_node_base *)pPVar24,
                           (_Rb_tree_node_base *)&splitters);
                splitters.elementIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((long)splitters.elementIndices.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1);
                pPVar36 = pPVar16;
              }
            }
            puVar27 = (pPVar36->elementIndices).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if (puVar27 ==
                (pPVar36->setIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pPVar16 = (Partitions *)
                        (pPVar36->elementIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              lVar23 = (long)(pPVar36->elementIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar16;
              if (lVar23 == 0x7ffffffffffffff0) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar33 = lVar23 >> 4;
              uVar22 = uVar33 + (uVar33 == 0);
              p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                         *)(uVar22 + uVar33);
              if ((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                   *)0x7fffffffffffffe < p_Var34) {
                p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)0x7ffffffffffffff;
              }
              if (CARRY8(uVar22,uVar33)) {
                p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)0x7ffffffffffffff;
              }
              pTVar18 = std::
                        _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                        ::_M_allocate(p_Var34,(size_t)pPVar21);
              sVar37 = (long)puVar27 - (long)pPVar16;
              *(pointer *)((long)pTVar18 + sVar37) =
                   markedPartitions.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              *(unsigned_long *)((long)pTVar18 + sVar37 + 8) = uVar29;
              if (0 < (long)sVar37) {
                pPVar21 = pPVar16;
                memmove(pTVar18,pPVar16,sVar37);
              }
              if (pPVar16 != (Partitions *)0x0) {
                pPVar21 = (Partitions *)
                          ((long)(pPVar36->setIndices).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)pPVar16);
                operator_delete(pPVar16,(ulong)pPVar21);
              }
              (pPVar36->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = &pTVar18->pred;
              (pPVar36->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar18 + sVar37 + 0x10);
              (pPVar36->setIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = &pTVar18[(long)p_Var34].pred;
            }
            else {
              *puVar27 = (unsigned_long)
                         markedPartitions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              puVar27[1] = uVar29;
              (pPVar36->elementIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = puVar27 + 2;
            }
            uVar29 = uVar29 + 1;
            puVar26 = puVar26 + 1;
          } while (puVar26 != puVar3);
        }
        markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)markedPartitions.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pvVar15 = (pointer)(newSplitter + 0x18);
    } while (pvVar15 !=
             (pointer)splitters.pivots.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  }
  sVar7 = splitter.index;
  p_Var34 = local_248;
  if ((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
       *)0x7ffffffffffffff < local_248) {
    std::__throw_length_error("vector::reserve");
  }
  if (local_248 ==
      (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
       *)0x0) {
    pTVar18 = (pointer)0x0;
    local_48 = (pointer)0x0;
  }
  else {
    pTVar18 = std::
              _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              ::_M_allocate(local_248,(size_t)pPVar21);
    local_48 = pTVar18 + (long)p_Var34;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,sVar7 + 1);
  __dest = pTVar18;
  if (sVar7 != 0) {
    puVar27 = (pointer)0x0;
    do {
      sVar37 = (long)__dest - (long)pTVar18;
      pvVar31 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)((long)sVar37 >> 4);
      resultPartitions = pvVar31;
      pPVar36 = &splitters;
      if (transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,
                   (iterator)
                   transitionIndices.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(unsigned_long *)&resultPartitions);
        pPVar21 = (Partitions *)
                  splitters.elements.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        *transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start = (unsigned_long)pvVar31;
        transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
        pPVar21 = (Partitions *)
                  splitters.elements.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      for (; pPVar21 != (Partitions *)0x0;
          pPVar21 = (Partitions *)
                    (&(pPVar21->elements).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish)[bVar40]) {
        bVar40 = (pPVar21->elementIndices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start < puVar27;
        if (!bVar40) {
          pPVar36 = pPVar21;
        }
      }
      pPVar21 = &splitters;
      if ((pPVar36 != &splitters) &&
         (pPVar21 = pPVar36,
         puVar27 < (pPVar36->elementIndices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start)) {
        pPVar21 = &splitters;
      }
      if (pPVar21 != &splitters) {
        markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = &pTVar18->pred;
        puVar4 = (pPVar21->elementIndices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar5 = (pPVar21->elementIndices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (puVar4 != puVar5) {
          uVar33 = (long)puVar5 - (long)puVar4;
          if ((ulong)((long)local_48 - (long)__dest) < uVar33) {
            pvVar19 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)((long)uVar33 >> 4);
            if ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)(0x7ffffffffffffffU - (long)pvVar31) < pvVar19) {
              std::__throw_length_error("vector::_M_range_insert");
            }
            if (pvVar19 < pvVar31) {
              pvVar19 = pvVar31;
            }
            p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                       *)((long)&(pvVar19->
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start +
                         (long)&(pvVar31->
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
            if ((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                 *)0x7fffffffffffffe < p_Var34) {
              p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                         *)0x7ffffffffffffff;
            }
            if (CARRY8((ulong)pvVar19,(ulong)pvVar31)) {
              p_Var34 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                         *)0x7ffffffffffffff;
            }
            pTVar18 = std::
                      _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                      ::_M_allocate(p_Var34,(size_t)puVar4);
            puVar5 = markedPartitions.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if ((pointer)markedPartitions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage != __dest) {
              memmove(pTVar18,markedPartitions.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,sVar37);
            }
            memcpy((void *)(sVar37 + (long)pTVar18),puVar4,uVar33);
            if (puVar5 != (pointer)0x0) {
              operator_delete(puVar5,(long)local_48 - (long)puVar5);
            }
            __dest = (pointer)((long)(sVar37 + (long)pTVar18) + uVar33);
            local_48 = pTVar18 + (long)p_Var34;
          }
          else {
            memmove(__dest,puVar4,uVar33);
            __dest = (pointer)((long)__dest + uVar33);
            pTVar18 = (pointer)markedPartitions.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
        }
      }
      puVar27 = (pointer)((long)puVar27 + 1);
    } while (puVar27 != (pointer)splitter.index);
  }
  pvVar31 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)((long)__dest - (long)pTVar18 >> 4);
  resultPartitions = pvVar31;
  if (transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = (_Link_type)
          transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_b8,
               (iterator)
               transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)&resultPartitions);
  }
  else {
    *transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = (unsigned_long)pvVar31;
    __x = (_Link_type)
          (transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 1);
    transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)__x;
  }
  this = &partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
              *)splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start,__x);
  anon_unknown_0::Partitions::Partitions((Partitions *)this,(size_t)pvVar31);
  if (local_228 != (undefined1  [8])0x0) {
    uVar29 = 0;
    uVar33 = 0;
    do {
      potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)potentialSplitters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&potentialSplitters;
      if (partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar33] !=
          partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar33]) {
        plVar1 = (long *)(partitions.sets +
                         partitions.beginnings.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[uVar33] * 8);
        plVar32 = (long *)(partitions.sets +
                          partitions.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[uVar33] * 8);
        do {
          psVar39 = *(size_t **)((long)auStack_b8 + (*plVar32 + 1) * 8);
          for (psStack_68 = *(size_t **)((long)auStack_b8 + *plVar32 * 8); psStack_68 < psVar39;
              psStack_68 = (size_t *)((long)psStack_68 + 1)) {
            this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&resultPartitions,&pTVar18[(long)psStack_68].label);
            __position._M_current = *(unsigned_long **)(this_00 + 8);
            if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        (this_00,__position,(unsigned_long *)&psStack_68);
            }
            else {
              *__position._M_current = (unsigned_long)psStack_68;
              *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          plVar32 = plVar32 + 1;
        } while (plVar32 != plVar1);
      }
      puVar14 = splitters.beginnings.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      puVar5 = splitters.setIndices.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar4 = splitters.elementIndices.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar27 = splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != &potentialSplitters) {
        markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             splitters.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        lVar23 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
        p_Var20 = (_Rb_tree_node_base *)
                  potentialSplitters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        do {
          puVar5[(long)partitions.pivots.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage] = uVar29;
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage
          [(long)partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage] = uVar29;
          p_Var6 = p_Var20[1]._M_left;
          for (p_Var25 = p_Var20[1]._M_parent; p_Var25 != p_Var6;
              p_Var25 = (_Base_ptr)&p_Var25->_M_parent) {
            lVar38 = *(long *)p_Var25;
            *(long *)(lVar23 + uVar29 * 8) = lVar38;
            puVar27[lVar38] = uVar29;
            puVar4[lVar38] =
                 (unsigned_long)
                 partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar29 = uVar29 + 1;
          }
          puVar14[(long)partitions.pivots.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage] = uVar29;
          partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)partitions.pivots.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
        } while (p_Var20 != (_Rb_tree_node_base *)&potentialSplitters);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)&resultPartitions);
      uVar33 = uVar33 + 1;
    } while (uVar33 < (ulong)local_228);
  }
  resultPartitions =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)0x0;
  potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&resultPartitions,
             (size_type)
             partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  psStack_68 = (size_t *)0x0;
  if (partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    do {
      if (potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&resultPartitions,
                   (iterator)
                   potentialSplitters.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(unsigned_long *)&psStack_68);
      }
      else {
        *potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start = (unsigned_long)psStack_68;
        potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start =
             potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      psStack_68 = (size_t *)((long)psStack_68 + 1);
    } while (psStack_68 <
             partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  while (resultPartitions !=
         (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    puVar27 = potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start + -1;
    potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_start + -1;
    psStack_68 = (size_t *)0x0;
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar29 = splitters.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage[*puVar27];
    if (splitters.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[*puVar27] != uVar29) {
      lVar23 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
      lVar38 = splitters.setIndices.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[*puVar27] << 3;
      do {
        sVar7 = pTVar18[*(long *)(lVar23 + lVar38)].pred;
        partition_2.partitions =
             (Partitions *)
             partitions.elementIndices.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[sVar7];
        auStack_88 = (undefined1  [8])local_228;
        if (partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[(long)partition_2.partitions] ==
            partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[(long)partition_2.partitions]) {
          if (markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psStack_68,
                       (iterator)
                       markedPartitions.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,(unsigned_long *)&partition_2);
          }
          else {
            *markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start = (unsigned_long)partition_2.partitions;
            markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        uVar33 = partitions.elements.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[sVar7];
        uVar8 = partitions.elementIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[sVar7];
        uVar22 = partitions.endings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar8];
        if (uVar22 <= uVar33) {
          lVar9 = *(long *)(partitions.sets + uVar22 * 8);
          *(long *)(partitions.sets + uVar33 * 8) = lVar9;
          partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[lVar9] = uVar33;
          *(size_t *)(partitions.sets + uVar22 * 8) = sVar7;
          partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[sVar7] = uVar22;
          partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar8] =
               partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[uVar8] + 1;
        }
        lVar38 = lVar38 + 8;
      } while (uVar29 << 3 != lVar38);
    }
    markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    psVar39 = psStack_68;
    if (psStack_68 !=
        markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        auStack_88 = (undefined1  [8])local_228;
        pPVar36 = (Partitions *)*psVar39;
        partition_2.partitions = pPVar36;
        pPVar21 = (Partitions *)anon_unknown_0::Partitions::Set::split((Set *)auStack_88);
        if (pPVar21 != (Partitions *)0x0) {
          if (partitions.beginnings.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar21] -
              partitions.setIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar21] <
              partitions.beginnings.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar36] -
              partitions.setIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar36]) {
            pPVar21 = pPVar36;
          }
          auStack_88 = (undefined1  [8])0x0;
          partition_2.partitions = (Partitions *)0x0;
          partition_2.index = 0;
          if (partitions.setIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar21] !=
              partitions.beginnings.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)pPVar21]) {
            plVar1 = (long *)(partitions.sets +
                             partitions.beginnings.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[(long)pPVar21] * 8);
            plVar32 = (long *)(partitions.sets +
                              partitions.setIndices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[(long)pPVar21] * 8);
            do {
              uVar33 = *(ulong *)((long)auStack_b8 + *plVar32 * 8);
              uVar22 = *(ulong *)((long)auStack_b8 + (*plVar32 + 1) * 8);
              if (uVar33 < uVar22) {
                do {
                  splitter.partitions =
                       (Partitions *)
                       splitters.elementIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[uVar33];
                  local_240 = (undefined1  [8])this;
                  if (splitters.endings.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[(long)splitter.partitions] ==
                      splitters.setIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[(long)splitter.partitions]) {
                    if (partition_2.partitions == (Partitions *)partition_2.index) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_88,
                                 (iterator)partition_2.partitions,(unsigned_long *)&splitter);
                    }
                    else {
                      (partition_2.partitions)->sets = (size_t)splitter.partitions;
                      partition_2.partitions = (Partitions *)&(partition_2.partitions)->elements;
                    }
                  }
                  uVar10 = splitters.elements.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[uVar33];
                  uVar29 = splitters.elementIndices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[uVar33];
                  uVar11 = splitters.endings.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[uVar29];
                  if (uVar11 <= uVar10) {
                    lVar38 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
                    lVar23 = *(long *)(lVar38 + uVar11 * 8);
                    *(long *)(lVar38 + uVar10 * 8) = lVar23;
                    splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[lVar23] = uVar10;
                    *(ulong *)(lVar38 + uVar11 * 8) = uVar33;
                    splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[uVar33] = uVar11;
                    splitters.endings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[uVar29] =
                         splitters.endings.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[uVar29] + 1;
                  }
                  uVar33 = uVar33 + 1;
                } while (uVar22 != uVar33);
              }
              plVar32 = plVar32 + 1;
            } while (plVar32 != plVar1);
          }
          pPVar36 = partition_2.partitions;
          for (auVar35 = auStack_88; auVar35 != (undefined1  [8])pPVar36;
              auVar35 = (undefined1  [8])&((Partitions *)auVar35)->elements) {
            splitter.partitions = (Partitions *)((Partitions *)auVar35)->sets;
            local_240 = (undefined1  [8])this;
            local_258 = anon_unknown_0::Partitions::Set::split((Set *)local_240);
            if (local_258 != 0) {
              if (potentialSplitters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  potentialSplitters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&resultPartitions,
                           (iterator)
                           potentialSplitters.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,&local_258);
              }
              else {
                *potentialSplitters.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start = local_258;
                potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     potentialSplitters.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
          }
          if (auStack_88 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_88,partition_2.index - (long)auStack_88);
          }
        }
        psVar39 = psVar39 + 1;
      } while (psVar39 !=
               markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (psStack_68 != (size_t *)0x0) {
      operator_delete(psStack_68,
                      (long)markedPartitions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)psStack_68);
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::reserve(__return_storage_ptr__,(size_type)local_228);
  if (local_228 != (undefined1  [8])0x0) {
    uVar33 = 0;
    do {
      psStack_68 = (size_t *)0x0;
      markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&psStack_68,
                 partitions.beginnings.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar33] -
                 partitions.setIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar33]);
      sVar7 = partitions.sets;
      uVar29 = partitions.beginnings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage[uVar33];
      if (partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage[uVar33] != uVar29) {
        lVar23 = partitions.setIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[uVar33] << 3;
        do {
          auStack_88 = *(undefined1 (*) [8])(sVar7 + lVar23);
          if (markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&psStack_68,
                       (iterator)
                       markedPartitions.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,(unsigned_long *)auStack_88);
          }
          else {
            *markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start = (unsigned_long)auStack_88;
            markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          lVar23 = lVar23 + 8;
        } while (uVar29 << 3 != lVar23);
      }
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)__return_storage_ptr__,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&psStack_68);
      if (psStack_68 != (size_t *)0x0) {
        operator_delete(psStack_68,
                        (long)markedPartitions.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)psStack_68);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < (ulong)local_228);
  }
  if (resultPartitions !=
      (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
       *)0x0) {
    operator_delete(resultPartitions,
                    (long)potentialSplitters.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)resultPartitions);
  }
  if (splitters.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.endings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.beginnings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.setIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.elementIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)splitters.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)splitters.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  pvVar13 = (void *)CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
  if (pvVar13 != (void *)0x0) {
    operator_delete(pvVar13,(long)splitters.elements.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pvVar13);
  }
  if (auStack_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_b8,
                    (long)transitionIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_b8);
  }
  if (pTVar18 != (pointer)0x0) {
    operator_delete(pTVar18,(long)local_48 - (long)pTVar18);
  }
  if (partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.endings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.beginnings.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.endings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.setIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.beginnings.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.elementIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.setIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(partitions.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)partitions.elementIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)partitions.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (partitions.sets != 0) {
    operator_delete((void *)partitions.sets,
                    (long)partitions.elements.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - partitions.sets);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<size_t>>
refinePartitionsImpl(const InputGraph& inputGraph) {
  // Find the number of states and transitions.
  size_t numElements = 0;
  size_t numTransitions = 0;
  for (const auto& partition : inputGraph) {
    numElements += partition.size();
    for (const auto& elem : partition) {
      numTransitions += elem.size();
    }
  }

  // The partitions of DFA states.
  Partitions partitions = initializeStatePartitions(inputGraph, numElements);

  // The transitions arranged such that the transitions leading to state `q` are
  // `transitions[transitionIndices[q] : transitionIndices[q+1]]`.
  std::vector<Transition> transitions;
  std::vector<size_t> transitionIndices;
  initializeTransitions(
    inputGraph, numElements, numTransitions, transitions, transitionIndices);

  // The splitters, which are partitions of the input transitions.
  Partitions splitters =
    initializeSplitterPartitions(partitions, transitions, transitionIndices);

  // The list of splitter partitions that might be able to split states in some
  // state partition. Starts out containing all splitter partitions.
  std::vector<size_t> potentialSplitters;
  potentialSplitters.reserve(splitters.sets);
  for (size_t i = 0; i < splitters.sets; ++i) {
    potentialSplitters.push_back(i);
  }

  while (!potentialSplitters.empty()) {
    size_t potentialSplitter = potentialSplitters.back();
    potentialSplitters.pop_back();

    // The partitions that may be able to be split.
    std::vector<size_t> markedPartitions;

    // Mark states that are predecessors via this splitter partition.
    for (size_t transition : splitters.getSet(potentialSplitter)) {
      size_t state = transitions[transition].pred;
      auto partition = partitions.getSetForElem(state);
      if (!partition.hasMarks()) {
        markedPartitions.push_back(partition.index);
      }
      partitions.mark(state);
    }

    // Try to split each partition with marked states.
    for (size_t partition : markedPartitions) {
      size_t newPartition = partitions.getSet(partition).split();
      if (!newPartition) {
        // There was nothing to split.
        continue;
      }

      // We only want to keep using the smaller of the two split partitions.
      if (partitions.getSet(newPartition).size() <
          partitions.getSet(partition).size()) {
        newPartition = partition;
      }

      // The splitter partitions that may need to be split to match the new
      // split of the state partitions.
      std::vector<size_t> markedSplitters;

      // Mark transitions that lead to the newly split off states.
      for (size_t state : partitions.getSet(newPartition)) {
        for (size_t t = transitionIndices[state],
                    end = transitionIndices[state + 1];
             t < end;
             ++t) {
          auto splitter = splitters.getSetForElem(t);
          if (!splitter.hasMarks()) {
            markedSplitters.push_back(splitter.index);
          }
          splitters.mark(t);
        }
      }

      // Split the splitters and update `potentialSplitters`.
      for (size_t splitter : markedSplitters) {
        size_t newSplitter = splitters.getSet(splitter).split();
        if (newSplitter) {
          potentialSplitters.push_back(newSplitter);
        }
      }
    }
  }

  // Return the refined partitions.
  std::vector<std::vector<size_t>> resultPartitions;
  resultPartitions.reserve(partitions.sets);
  for (size_t p = 0; p < partitions.sets; ++p) {
    auto partition = partitions.getSet(p);
    std::vector<size_t> resultPartition;
    resultPartition.reserve(partition.size());
    for (size_t elem : partition) {
      resultPartition.push_back(elem);
    }
    resultPartitions.emplace_back(std::move(resultPartition));
  }
  return resultPartitions;
}